

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O1

void dlep_radio_apply_interface_settings(dlep_radio_if *interface)

{
  list_entity *plVar1;
  avl_tree *paVar2;
  list_entity *plVar3;
  
  oonf_packet_apply_managed(&(interface->interf).udp,&(interface->interf).udp_config);
  oonf_stream_apply_managed(&interface->tcp,&interface->tcp_config);
  paVar2 = dlep_extension_get_tree();
  plVar3 = (paVar2->list_head).next;
  while( true ) {
    plVar1 = plVar3->prev;
    paVar2 = dlep_extension_get_tree();
    if (plVar1 == (paVar2->list_head).prev) break;
    if (plVar3[-3].next != (list_entity *)0x0) {
      (*(code *)plVar3[-3].next)(interface);
    }
    plVar3 = plVar3->next;
  }
  return;
}

Assistant:

void
dlep_radio_apply_interface_settings(struct dlep_radio_if *interface) {
  struct dlep_extension *ext;

  oonf_packet_apply_managed(&interface->interf.udp, &interface->interf.udp_config);
  oonf_stream_apply_managed(&interface->tcp, &interface->tcp_config);

  avl_for_each_element(dlep_extension_get_tree(), ext, _node) {
    if (ext->cb_session_apply_radio) {
      ext->cb_session_apply_radio(&interface->interf.session);
    }
  }
}